

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.h
# Opt level: O2

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTolerances(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,shared_ptr<soplex::Tolerances> *tolerances)

{
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->updPrimRhs)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->updPrimVec)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void setTolerances(std::shared_ptr<Tolerances> tolerances)
   {
      this->_tolerances = tolerances;
      this->updPrimRhs.setTolerances(tolerances);
      this->updPrimVec.setTolerances(tolerances);
   }